

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TransformFeedbackTests::init
          (TransformFeedbackTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  Precision PVar2;
  uint uVar3;
  _func_int **pp_Var4;
  bool bVar5;
  DataType DVar6;
  uint uVar7;
  TestNode *pTVar8;
  long *plVar9;
  long lVar10;
  TestNode *pTVar11;
  undefined8 extraout_RAX;
  TestNode *pTVar12;
  char *pcVar13;
  undefined8 uVar14;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  long *plVar15;
  size_type *psVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  uint local_24c;
  long local_248;
  TestNode *local_240;
  TestNode *local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  TestNode *local_210;
  long local_208;
  long local_200;
  TestNode *local_1f8;
  allocator<char> local_1e9;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  string name;
  ios_base local_138 [264];
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"position",
             "gl_Position capture using transform feedback");
  local_240 = pTVar8;
  local_238 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar10 = 0;
  do {
    pcVar13 = init::primitiveTypes[lVar10].name;
    lVar20 = 0;
    bVar5 = true;
    local_248 = lVar10;
    do {
      bVar17 = bVar5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,pcVar13,(allocator<char> *)&local_1e8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_270 = &local_260;
      plVar15 = plVar9 + 2;
      if ((long *)*plVar9 == plVar15) {
        local_260 = *plVar15;
        lStack_258 = plVar9[3];
      }
      else {
        local_260 = *plVar15;
        local_270 = (long *)*plVar9;
      }
      local_268 = plVar9[1];
      *plVar9 = (long)plVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar16 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar16) {
        name.field_2._M_allocated_capacity = *psVar16;
        name.field_2._8_8_ = plVar9[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar16;
        name._M_dataplus._M_p = (pointer)*plVar9;
      }
      name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar16;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      pTVar8 = (TestNode *)operator_new(0x148);
      TransformFeedback::PositionCase::PositionCase
                ((PositionCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,name._M_dataplus._M_p
                 ,::glcts::fixed_sample_locations_values + 1,init::bufferModes[lVar20].mode,
                 init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(local_240,pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar20 = 1;
      bVar5 = false;
    } while (bVar17);
    lVar10 = local_248 + 1;
  } while (lVar10 != 3);
  pTVar11 = (TestNode *)operator_new(0x70);
  pTVar8 = local_238;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,local_238->m_testCtx,"point_size",
             "gl_PointSize capture using transform feedback");
  local_240 = pTVar11;
  tcu::TestNode::addChild(pTVar8,pTVar11);
  lVar10 = 0;
  do {
    pcVar13 = init::primitiveTypes[lVar10].name;
    lVar20 = 0;
    bVar5 = true;
    local_248 = lVar10;
    do {
      bVar17 = bVar5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,pcVar13,(allocator<char> *)&local_1e8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_270 = &local_260;
      plVar15 = plVar9 + 2;
      if ((long *)*plVar9 == plVar15) {
        local_260 = *plVar15;
        lStack_258 = plVar9[3];
      }
      else {
        local_260 = *plVar15;
        local_270 = (long *)*plVar9;
      }
      local_268 = plVar9[1];
      *plVar9 = (long)plVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar16 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar16) {
        name.field_2._M_allocated_capacity = *psVar16;
        name.field_2._8_8_ = plVar9[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar16;
        name._M_dataplus._M_p = (pointer)*plVar9;
      }
      name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar16;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      pTVar8 = (TestNode *)operator_new(0x148);
      TransformFeedback::PointSizeCase::PointSizeCase
                ((PointSizeCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,
                 name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                 init::bufferModes[lVar20].mode,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(local_240,pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar20 = 1;
      bVar5 = false;
    } while (bVar17);
    lVar10 = local_248 + 1;
  } while (lVar10 != 3);
  pTVar11 = (TestNode *)operator_new(0x70);
  pTVar8 = local_238;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,local_238->m_testCtx,"basic_types",
             "Basic types in transform feedback");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  uVar14 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar10 = 0;
  local_1f8 = pTVar11;
  do {
    pTVar11 = local_1f8;
    local_24c = (uint)uVar14;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::bufferModes[lVar10].name,
               ::glcts::fixed_sample_locations_values + 1);
    local_248 = CONCAT44(local_248._4_4_,init::bufferModes[lVar10].mode);
    local_210 = pTVar12;
    tcu::TestNode::addChild(pTVar11,pTVar12);
    lVar10 = 0;
    do {
      pTVar11 = (TestNode *)operator_new(0x70);
      local_208 = lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,init::primitiveTypes[lVar10].name,
                 ::glcts::fixed_sample_locations_values + 1);
      local_240 = (TestNode *)CONCAT44(local_240._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(local_210,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_200 = lVar10;
        DVar6 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar13 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,pcVar13,(allocator<char> *)&local_1e8);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_270 = &local_260;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_260 = *plVar15;
            lStack_258 = plVar9[3];
          }
          else {
            local_260 = *plVar15;
            local_270 = (long *)*plVar9;
          }
          local_268 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar16 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar16) {
            name.field_2._M_allocated_capacity = *psVar16;
            name.field_2._8_8_ = plVar9[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar16;
            name._M_dataplus._M_p = (pointer)*plVar9;
          }
          name._M_string_length = plVar9[1];
          *plVar9 = (long)psVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          pTVar8 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,
                     name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_248,(deUint32)local_240,DVar1,PVar2,
                     (uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar8 = local_238;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_200 + 1;
      } while (lVar10 != 0x15);
      lVar10 = local_208 + 1;
    } while (lVar10 != 3);
    lVar10 = 1;
    uVar14 = 0;
  } while ((local_24c & 1) != 0);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,"array","Capturing whole array in TF");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  uVar14 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
  lVar10 = 0;
  local_1f8 = pTVar11;
  do {
    pTVar11 = local_1f8;
    local_24c = (uint)uVar14;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::bufferModes[lVar10].name,
               ::glcts::fixed_sample_locations_values + 1);
    local_248 = CONCAT44(local_248._4_4_,init::bufferModes[lVar10].mode);
    local_210 = pTVar12;
    tcu::TestNode::addChild(pTVar11,pTVar12);
    lVar10 = 0;
    do {
      pTVar11 = (TestNode *)operator_new(0x70);
      local_208 = lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,init::primitiveTypes[lVar10].name,
                 ::glcts::fixed_sample_locations_values + 1);
      local_240 = (TestNode *)CONCAT44(local_240._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(local_210,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_200 = lVar10;
        DVar6 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar13 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,pcVar13,(allocator<char> *)&local_1e8);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_270 = &local_260;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_260 = *plVar15;
            lStack_258 = plVar9[3];
          }
          else {
            local_260 = *plVar15;
            local_270 = (long *)*plVar9;
          }
          local_268 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar16 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar16) {
            name.field_2._M_allocated_capacity = *psVar16;
            name.field_2._8_8_ = plVar9[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar16;
            name._M_dataplus._M_p = (pointer)*plVar9;
          }
          name._M_string_length = plVar9[1];
          *plVar9 = (long)psVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          pTVar8 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicArrayCase::BasicArrayCase
                    ((BasicArrayCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,
                     name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_248,(deUint32)local_240,DVar1,PVar2,
                     (uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar8 = local_238;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_200 + 1;
      } while (lVar10 != 0x15);
      lVar10 = local_208 + 1;
    } while (lVar10 != 3);
    lVar10 = 1;
    uVar14 = 0;
  } while ((local_24c & 1) != 0);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,"array_element",
             "Capturing single array element in TF");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  uVar14 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
  lVar10 = 0;
  local_1f8 = pTVar11;
  do {
    pTVar11 = local_1f8;
    local_24c = (uint)uVar14;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::bufferModes[lVar10].name,
               ::glcts::fixed_sample_locations_values + 1);
    local_248 = CONCAT44(local_248._4_4_,init::bufferModes[lVar10].mode);
    local_210 = pTVar12;
    tcu::TestNode::addChild(pTVar11,pTVar12);
    lVar10 = 0;
    do {
      pTVar11 = (TestNode *)operator_new(0x70);
      local_208 = lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,init::primitiveTypes[lVar10].name,
                 ::glcts::fixed_sample_locations_values + 1);
      local_240 = (TestNode *)CONCAT44(local_240._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(local_210,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_200 = lVar10;
        DVar6 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar13 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,pcVar13,(allocator<char> *)&local_1e8);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_270 = &local_260;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_260 = *plVar15;
            lStack_258 = plVar9[3];
          }
          else {
            local_260 = *plVar15;
            local_270 = (long *)*plVar9;
          }
          local_268 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar16 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar16) {
            name.field_2._M_allocated_capacity = *psVar16;
            name.field_2._8_8_ = plVar9[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar16;
            name._M_dataplus._M_p = (pointer)*plVar9;
          }
          name._M_string_length = plVar9[1];
          *plVar9 = (long)psVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          pTVar8 = (TestNode *)operator_new(0x148);
          TransformFeedback::ArrayElementCase::ArrayElementCase
                    ((ArrayElementCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,
                     name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_248,(deUint32)local_240,DVar1,PVar2,
                     (uint)(DVar6 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar8 = local_238;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_200 + 1;
      } while (lVar10 != 0x15);
      lVar10 = local_208 + 1;
    } while (lVar10 != 3);
    lVar10 = 1;
    uVar14 = 0;
  } while ((local_24c & 1) != 0);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,"interpolation",
             "Different interpolation modes in transform feedback varyings");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  lVar10 = 0;
  local_210 = pTVar11;
  do {
    pTVar11 = local_210;
    local_240 = (TestNode *)(ulong)init::interpModes[lVar10].interp;
    local_208 = lVar10;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::interpModes[lVar10].name,
               ::glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar11,pTVar12);
    lVar10 = 0;
    do {
      PVar2 = init::precisions[lVar10];
      lVar20 = 0;
      local_200 = lVar10;
      do {
        lVar10 = 0;
        bVar5 = true;
        local_248 = lVar20;
        do {
          bVar17 = bVar5;
          pcVar13 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,pcVar13,&local_1e9)
          ;
          plVar9 = (long *)std::__cxx11::string::append((char *)local_1c8);
          local_1e8 = &local_1d8;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_1d8 = *plVar15;
            lStack_1d0 = plVar9[3];
          }
          else {
            local_1d8 = *plVar15;
            local_1e8 = (long *)*plVar9;
          }
          local_1e0 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e8);
          local_230 = &local_220;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_220 = *plVar15;
            lStack_218 = plVar9[3];
          }
          else {
            local_220 = *plVar15;
            local_230 = (long *)*plVar9;
          }
          local_228 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
          local_270 = &local_260;
          plVar15 = plVar9 + 2;
          if ((long *)*plVar9 == plVar15) {
            local_260 = *plVar15;
            lStack_258 = plVar9[3];
          }
          else {
            local_260 = *plVar15;
            local_270 = (long *)*plVar9;
          }
          local_268 = plVar9[1];
          *plVar9 = (long)plVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar16 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar16) {
            name.field_2._M_allocated_capacity = *psVar16;
            name.field_2._8_8_ = plVar9[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar16;
            name._M_dataplus._M_p = (pointer)*plVar9;
          }
          name._M_string_length = plVar9[1];
          *plVar9 = (long)psVar16;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8,local_1d8 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          pTVar8 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar8,(Context *)local_238[1]._vptr_TestNode,
                     name._M_dataplus._M_p,::glcts::fixed_sample_locations_values + 1,
                     init::bufferModes[lVar10].mode,init::primitiveTypes[lVar20].type,
                     TYPE_FLOAT_VEC4,PVar2,(Interpolation)local_240);
          tcu::TestNode::addChild(pTVar12,pTVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar8 = local_238;
          lVar10 = 1;
          bVar5 = false;
        } while (bVar17);
        lVar20 = local_248 + 1;
      } while (lVar20 != 3);
      lVar10 = local_200 + 1;
    } while (lVar10 != 3);
    lVar10 = local_208 + 1;
  } while (lVar10 != 3);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,pTVar8->m_testCtx,"random",
             "Randomized transform feedback cases");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  uVar14 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
  lVar10 = 0;
  local_1f8 = pTVar11;
  do {
    pTVar11 = local_1f8;
    local_24c = (uint)uVar14;
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::bufferModes[lVar10].name,
               ::glcts::fixed_sample_locations_values + 1);
    uVar3 = init::bufferModes[lVar10].mode;
    tcu::TestNode::addChild(pTVar11,pTVar12);
    local_248 = CONCAT44(local_248._4_4_,uVar3);
    uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
    local_208 = CONCAT44(local_208._4_4_,(uVar3 >> 4 ^ uVar3) * 0x27d4eb2d);
    lVar10 = 0;
    local_210 = pTVar12;
    do {
      pTVar11 = local_210;
      pTVar12 = (TestNode *)operator_new(0x70);
      local_200 = lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,pTVar8->m_testCtx,init::primitiveTypes[lVar10].name,
                 ::glcts::fixed_sample_locations_values + 1);
      uVar3 = init::primitiveTypes[lVar10].type;
      local_240 = pTVar12;
      tcu::TestNode::addChild(pTVar11,pTVar12);
      uVar19 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
      uVar19 = (uVar19 >> 4 ^ uVar19) * 0x27d4eb2d ^ (uint)local_208;
      iVar18 = 1;
      do {
        pTVar11 = (TestNode *)operator_new(0x148);
        pp_Var4 = pTVar8[1]._vptr_TestNode;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::ostream::operator<<(&name,iVar18);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar11,(TestContext *)*pp_Var4,(char *)local_270,
                   ::glcts::fixed_sample_locations_values + 1);
        uVar7 = (iVar18 - 1U ^ 0x3d) * 9;
        uVar7 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d ^ uVar19;
        pTVar11[1]._vptr_TestNode = pp_Var4;
        pTVar11[1].m_testCtx = (TestContext *)0x0;
        pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
        pTVar11[1].m_name._M_string_length = 0;
        pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 8) = 0;
        pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar11[1].m_description._M_string_length = 0;
        pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
        pTVar11[1].m_nodeType = (TestNodeType)local_248;
        *(uint *)&pTVar11[1].field_0x54 = uVar3;
        *(undefined4 *)
         &pTVar11[1].m_children.
          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar11[2]._vptr_TestNode = (_func_int **)0x0;
        pTVar11[2].m_testCtx = (TestContext *)0x0;
        pTVar11[2].m_name._M_dataplus._M_p = (pointer)0x0;
        pTVar11[2].m_name._M_string_length = 0;
        pTVar11[2].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar11[2].m_name.field_2 + 8) = 0;
        pTVar11[2].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar11[2].m_description._M_string_length = 0;
        pTVar11[2].m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar11[2].m_description.field_2 + 8) = 0;
        *(undefined8 *)&pTVar11[2].m_nodeType = 0;
        pTVar11[2].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined4 *)
         &pTVar11[2].m_children.
          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = 0;
        pTVar11->_vptr_TestNode = (_func_int **)&PTR__TransformFeedbackCase_02141758;
        *(uint *)((long)&pTVar11[2].m_children.
                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 4) = uVar7 >> 0xf ^ uVar7;
        tcu::TestNode::addChild(local_240,pTVar11);
        pTVar8 = local_238;
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != 0xb);
      lVar10 = local_200 + 1;
    } while (lVar10 != 3);
    lVar10 = 1;
    uVar14 = 0;
  } while ((local_24c & 1) != 0);
  return 0;
}

Assistant:

void TransformFeedbackTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} bufferModes[] =
	{
		{ "separate",		GL_SEPARATE_ATTRIBS		},
		{ "interleaved",	GL_INTERLEAVED_ATTRIBS	}
	};

	static const struct
	{
		const char*		name;
		deUint32		type;
	} primitiveTypes[] =
	{
		{ "points",			GL_POINTS			},
		{ "lines",			GL_LINES			},
		{ "triangles",		GL_TRIANGLES		}

		// Not supported by GLES3.
//		{ "line_strip",		GL_LINE_STRIP		},
//		{ "line_loop",		GL_LINE_LOOP		},
//		{ "triangle_fan",	GL_TRIANGLE_FAN		},
//		{ "triangle_strip",	GL_TRIANGLE_STRIP	}
	};

	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	static const struct
	{
		const char*		name;
		Interpolation	interp;
	} interpModes[] =
	{
		{ "smooth",		INTERPOLATION_SMOOTH	},
		{ "flat",		INTERPOLATION_FLAT		},
		{ "centroid",	INTERPOLATION_CENTROID	}
	};

	// .position
	{
		tcu::TestCaseGroup* positionGroup = new tcu::TestCaseGroup(m_testCtx, "position", "gl_Position capture using transform feedback");
		addChild(positionGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				positionGroup->addChild(new PositionCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .point_size
	{
		tcu::TestCaseGroup* pointSizeGroup = new tcu::TestCaseGroup(m_testCtx, "point_size", "gl_PointSize capture using transform feedback");
		addChild(pointSizeGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				pointSizeGroup->addChild(new PointSizeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .basic_type
	{
		tcu::TestCaseGroup* basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_types", "Basic types in transform feedback");
		addChild(basicTypeGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			basicTypeGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Capturing whole array in TF");
		addChild(arrayGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicArrayCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array_element
	{
		tcu::TestCaseGroup* arrayElemGroup = new tcu::TestCaseGroup(m_testCtx, "array_element", "Capturing single array element in TF");
		addChild(arrayElemGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayElemGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new ArrayElementCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* interpolationGroup = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Different interpolation modes in transform feedback varyings");
		addChild(interpolationGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(interpModes); modeNdx++)
		{
			Interpolation		interp		= interpModes[modeNdx].interp;
			tcu::TestCaseGroup*	modeGroup	= new tcu::TestCaseGroup(m_testCtx, interpModes[modeNdx].name, "");

			interpolationGroup->addChild(modeGroup);

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision precision = precisions[precNdx];

				for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
				{
					for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
					{
						string name = string(glu::getPrecisionName(precision)) + "_vec4_" + primitiveTypes[primitiveType].name + "_" + bufferModes[bufferMode].name;
						modeGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type, glu::TYPE_FLOAT_VEC4, precision, interp));
					}
				}
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized transform feedback cases");
		addChild(randomGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			randomGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int ndx = 0; ndx < 10; ndx++)
				{
					deUint32 seed = deInt32Hash(bufferMode) ^ deInt32Hash(primitiveType) ^ deInt32Hash(ndx);
					primitiveGroup->addChild(new RandomCase(m_context, de::toString(ndx+1).c_str(), "", bufferMode, primitiveType, seed));
				}
			}
		}
	}
}